

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

void lock_now(quicly_conn_t *conn,int is_reentrant)

{
  uint8_t *puVar1;
  st_quicly_now_t *psVar2;
  int64_t iVar3;
  
  if ((conn->stash).now == 0) {
    if ((conn->stash).lock_count != '\0') {
      __assert_fail("conn->stash.lock_count == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x1e1,"void lock_now(quicly_conn_t *, int)");
    }
    psVar2 = ((conn->super).ctx)->now;
    iVar3 = (*psVar2->cb)(psVar2);
    (conn->stash).now = iVar3;
  }
  else {
    if (is_reentrant == 0) {
      __assert_fail("is_reentrant && \"caller must be reentrant\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x1e4,"void lock_now(quicly_conn_t *, int)");
    }
    if ((conn->stash).lock_count == '\0') {
      __assert_fail("conn->stash.lock_count != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x1e5,"void lock_now(quicly_conn_t *, int)");
    }
  }
  puVar1 = &(conn->stash).lock_count;
  *puVar1 = *puVar1 + '\x01';
  return;
}

Assistant:

static void lock_now(quicly_conn_t *conn, int is_reentrant)
{
    if (conn->stash.now == 0) {
        assert(conn->stash.lock_count == 0);
        conn->stash.now = conn->super.ctx->now->cb(conn->super.ctx->now);
    } else {
        assert(is_reentrant && "caller must be reentrant");
        assert(conn->stash.lock_count != 0);
    }

    ++conn->stash.lock_count;
}